

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotErrorBarsEx<ImPlot::GetterError<unsigned_int>>
               (char *label_id,GetterError<unsigned_int> *getter)

{
  uint uVar1;
  ImPlotContext *pIVar2;
  bool bVar3;
  ImU32 col;
  long lVar4;
  ImDrawList *this;
  int iVar5;
  int iVar6;
  float fVar7;
  ImVec2 IVar8;
  double dVar9;
  double dVar10;
  ImVec2 p1;
  ImVec2 p2;
  ImVec2 local_88;
  ImPlotPoint local_80;
  float local_6c;
  ImVec2 local_68;
  ImVec2 local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  bVar3 = BeginItem(label_id,-1);
  if (bVar3) {
    if ((GImPlot->FitThisFrame == true) && (iVar5 = getter->Count, 0 < iVar5)) {
      iVar6 = 0;
      do {
        lVar4 = (long)(((getter->Offset + iVar6) % iVar5 + iVar5) % iVar5) * (long)getter->Stride;
        IVar8 = (ImVec2)(double)*(uint *)((long)getter->Xs + lVar4);
        dVar9 = (double)*(uint *)((long)getter->Ys + lVar4);
        uVar1 = *(uint *)((long)getter->Pos + lVar4);
        local_80.y = dVar9 - (double)*(uint *)((long)getter->Neg + lVar4);
        local_80.x = (double)IVar8;
        FitPoint(&local_80);
        local_80.y = (double)uVar1 + dVar9;
        local_80.x = (double)IVar8;
        FitPoint(&local_80);
        iVar6 = iVar6 + 1;
        iVar5 = getter->Count;
      } while (iVar6 < iVar5);
    }
    pIVar2 = GImPlot;
    this = GetPlotDrawList();
    col = ImGui::GetColorU32((pIVar2->NextItemData).Colors + 4);
    iVar5 = getter->Count;
    if (0 < iVar5) {
      local_6c = (pIVar2->NextItemData).ErrorBarSize;
      local_48 = ZEXT416((uint)(local_6c * 0.5));
      local_58 = ZEXT416((uint)(local_6c * 0.5));
      iVar6 = 0;
      do {
        lVar4 = (long)(((getter->Offset + iVar6) % iVar5 + iVar5) % iVar5) * (long)getter->Stride;
        dVar9 = (double)*(uint *)((long)getter->Xs + lVar4);
        dVar10 = (double)*(uint *)((long)getter->Ys + lVar4);
        uVar1 = *(uint *)((long)getter->Pos + lVar4);
        local_80.x = (double)PlotToPixels(dVar9,dVar10 - (double)*(uint *)((long)getter->Neg + lVar4
                                                                          ),-1);
        local_60 = PlotToPixels(dVar9,(double)uVar1 + dVar10,-1);
        ImDrawList::AddLine(this,(ImVec2 *)&local_80,&local_60,col,
                            (pIVar2->NextItemData).ErrorBarWeight);
        if (0.0 < local_6c) {
          fVar7 = (float)((ulong)local_80.x >> 0x20);
          local_88.y = fVar7;
          local_88.x = SUB84(local_80.x,0) - (float)local_48._0_4_;
          local_68.y = fVar7 + (float)local_58._4_4_;
          local_68.x = SUB84(local_80.x,0) + (float)local_58._0_4_;
          ImDrawList::AddLine(this,&local_88,&local_68,col,(pIVar2->NextItemData).ErrorBarWeight);
          local_88.y = local_60.y;
          local_88.x = local_60.x - (float)local_48._0_4_;
          local_68.y = local_60.y + (float)local_58._4_4_;
          local_68.x = local_60.x + (float)local_58._0_4_;
          ImDrawList::AddLine(this,&local_88,&local_68,col,(pIVar2->NextItemData).ErrorBarWeight);
        }
        iVar6 = iVar6 + 1;
        iVar5 = getter->Count;
      } while (iVar6 < iVar5);
    }
    pIVar2 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar2->NextItemData);
    pIVar2->PreviousItem = pIVar2->CurrentItem;
    pIVar2->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

void PlotErrorBarsEx(const char* label_id, const Getter& getter) {
    if (BeginItem(label_id)) {
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPointError e = getter(i);
                FitPoint(ImPlotPoint(e.X , e.Y - e.Neg));
                FitPoint(ImPlotPoint(e.X , e.Y + e.Pos ));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        const ImU32 col = ImGui::GetColorU32(s.Colors[ImPlotCol_ErrorBar]);
        const bool rend_whisker  = s.ErrorBarSize > 0;
        const float half_whisker = s.ErrorBarSize * 0.5f;
        for (int i = 0; i < getter.Count; ++i) {
            ImPlotPointError e = getter(i);
            ImVec2 p1 = PlotToPixels(e.X, e.Y - e.Neg);
            ImVec2 p2 = PlotToPixels(e.X, e.Y + e.Pos);
            DrawList.AddLine(p1,p2,col, s.ErrorBarWeight);
            if (rend_whisker) {
                DrawList.AddLine(p1 - ImVec2(half_whisker, 0), p1 + ImVec2(half_whisker, 0), col, s.ErrorBarWeight);
                DrawList.AddLine(p2 - ImVec2(half_whisker, 0), p2 + ImVec2(half_whisker, 0), col, s.ErrorBarWeight);
            }
        }
        EndItem();
    }
}